

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O1

void __thiscall LLVMBC::StreamState::append(StreamState *this,FunctionType *type)

{
  uint uVar1;
  uint uVar2;
  Type *type_00;
  Type *local_28;
  
  local_28 = FunctionType::getReturnType(type);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"(",1);
  append<LLVMBC::Type*,char_const(&)[7]>(this,&local_28,(char (*) [7])" (*) (");
  uVar1 = FunctionType::getNumParams(type);
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      type_00 = FunctionType::getParamType(type,uVar1);
      append(this,type_00);
      uVar1 = uVar1 + 1;
      uVar2 = FunctionType::getNumParams(type);
      if (uVar1 < uVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      }
      uVar2 = FunctionType::getNumParams(type);
    } while (uVar1 < uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"))",2);
  return;
}

Assistant:

void StreamState::append(FunctionType *type)
{
	append("(", type->getReturnType(), " (*) (");
	for (unsigned i = 0; i < type->getNumParams(); i++)
	{
		append(type->getParamType(i));
		if (i + 1 < type->getNumParams())
			append(", ");
	}
	append("))");
}